

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

char * mksymname(lua_State *L,char *modname,char *prefix)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strchr(modname,0x2d);
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = modname;
  }
  pcVar2 = luaL_gsub(L,pcVar2,".","_");
  pcVar2 = lua_pushfstring(L,prefix,pcVar2);
  lua_remove(L,-2);
  return pcVar2;
}

Assistant:

static const char *mksymname(lua_State *L, const char *modname,
			     const char *prefix)
{
  const char *funcname;
  const char *mark = strchr(modname, *LUA_IGMARK);
  if (mark) modname = mark + 1;
  funcname = luaL_gsub(L, modname, ".", "_");
  funcname = lua_pushfstring(L, prefix, funcname);
  lua_remove(L, -2);  /* remove 'gsub' result */
  return funcname;
}